

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx::ArrayIntersectorK_1<8,_embree::avx::ObjectIntersectorK<8,_false>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  byte bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  bool bVar36;
  _func_int **pp_Var37;
  ulong uVar38;
  ulong uVar39;
  undefined4 uVar40;
  ulong uVar41;
  ulong uVar42;
  NodeRef nodeRef;
  ulong *puVar43;
  undefined1 (*pauVar44) [32];
  long lVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  vint<8> mask;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  RTCIntersectFunctionNArguments local_2778;
  Geometry *local_2748;
  undefined8 local_2740;
  RTCIntersectArguments *local_2738;
  undefined1 local_2730 [16];
  undefined1 local_2720 [32];
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong auStack_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar64 [64];
  undefined1 auVar68 [64];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar25 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
      auVar26 = vpcmpeqd_avx(auVar25,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
      auVar25 = vpcmpeqd_avx(auVar25,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
      auVar26 = vpackssdw_avx(auVar26,auVar25);
      auVar25 = vpacksswb_avx(auVar26,auVar26);
      bVar28 = SUB161(auVar25 >> 7,0) & 1 | (SUB161(auVar25 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar25 >> 0x17,0) & 1) << 2 | (SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar25 >> 0x27,0) & 1) << 4 | (SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar25 >> 0x37,0) & 1) << 6 | SUB161(auVar25 >> 0x3f,0) << 7;
      if (bVar28 != 0) {
        uVar38 = (ulong)bVar28;
        local_2660 = *(undefined8 *)ray;
        uStack_2658 = *(undefined8 *)(ray + 8);
        uStack_2650 = *(undefined8 *)(ray + 0x10);
        uStack_2648 = *(undefined8 *)(ray + 0x18);
        local_2680 = *(undefined8 *)(ray + 0x20);
        uStack_2678 = *(undefined8 *)(ray + 0x28);
        uStack_2670 = *(undefined8 *)(ray + 0x30);
        uStack_2668 = *(undefined8 *)(ray + 0x38);
        local_26a0 = *(undefined8 *)(ray + 0x40);
        uStack_2698 = *(undefined8 *)(ray + 0x48);
        uStack_2690 = *(undefined8 *)(ray + 0x50);
        uStack_2688 = *(undefined8 *)(ray + 0x58);
        auVar82 = *(undefined1 (*) [32])(ray + 0x80);
        auVar48._8_4_ = 0x7fffffff;
        auVar48._0_8_ = 0x7fffffff7fffffff;
        auVar48._12_4_ = 0x7fffffff;
        auVar48._16_4_ = 0x7fffffff;
        auVar48._20_4_ = 0x7fffffff;
        auVar48._24_4_ = 0x7fffffff;
        auVar48._28_4_ = 0x7fffffff;
        auVar77 = vandps_avx(auVar82,auVar48);
        auVar66._8_4_ = 0x219392ef;
        auVar66._0_8_ = 0x219392ef219392ef;
        auVar66._12_4_ = 0x219392ef;
        auVar66._16_4_ = 0x219392ef;
        auVar66._20_4_ = 0x219392ef;
        auVar66._24_4_ = 0x219392ef;
        auVar66._28_4_ = 0x219392ef;
        auVar77 = vcmpps_avx(auVar77,auVar66,1);
        auVar76 = vblendvps_avx(auVar82,auVar66,auVar77);
        auVar77 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar48);
        auVar77 = vcmpps_avx(auVar77,auVar66,1);
        auVar49 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar66,auVar77);
        auVar77 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar48);
        auVar77 = vcmpps_avx(auVar77,auVar66,1);
        auVar77 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar66,auVar77);
        auVar48 = vrcpps_avx(auVar76);
        fVar4 = auVar48._0_4_;
        fVar7 = auVar48._4_4_;
        auVar27._4_4_ = auVar76._4_4_ * fVar7;
        auVar27._0_4_ = auVar76._0_4_ * fVar4;
        fVar10 = auVar48._8_4_;
        auVar27._8_4_ = auVar76._8_4_ * fVar10;
        fVar13 = auVar48._12_4_;
        auVar27._12_4_ = auVar76._12_4_ * fVar13;
        fVar16 = auVar48._16_4_;
        auVar27._16_4_ = auVar76._16_4_ * fVar16;
        fVar19 = auVar48._20_4_;
        auVar27._20_4_ = auVar76._20_4_ * fVar19;
        fVar22 = auVar48._24_4_;
        auVar27._24_4_ = auVar76._24_4_ * fVar22;
        auVar27._28_4_ = 0x219392ef;
        auVar75._8_4_ = 0x3f800000;
        auVar75._0_8_ = &DAT_3f8000003f800000;
        auVar75._12_4_ = 0x3f800000;
        auVar75._16_4_ = 0x3f800000;
        auVar75._20_4_ = 0x3f800000;
        auVar75._24_4_ = 0x3f800000;
        auVar75._28_4_ = 0x3f800000;
        auVar66 = vsubps_avx(auVar75,auVar27);
        auVar27 = vrcpps_avx(auVar49);
        fVar5 = auVar27._0_4_;
        auVar63._0_4_ = auVar49._0_4_ * fVar5;
        fVar8 = auVar27._4_4_;
        auVar63._4_4_ = auVar49._4_4_ * fVar8;
        fVar11 = auVar27._8_4_;
        auVar63._8_4_ = auVar49._8_4_ * fVar11;
        fVar14 = auVar27._12_4_;
        auVar63._12_4_ = auVar49._12_4_ * fVar14;
        fVar17 = auVar27._16_4_;
        auVar63._16_4_ = auVar49._16_4_ * fVar17;
        fVar20 = auVar27._20_4_;
        auVar63._20_4_ = auVar49._20_4_ * fVar20;
        fVar23 = auVar27._24_4_;
        auVar63._28_36_ = in_ZMM6._28_36_;
        auVar63._24_4_ = auVar49._24_4_ * fVar23;
        auVar49 = vrcpps_avx(auVar77);
        auVar54 = vsubps_avx(auVar75,auVar63._0_32_);
        fVar6 = auVar49._0_4_;
        fVar9 = auVar49._4_4_;
        auVar76._4_4_ = auVar77._4_4_ * fVar9;
        auVar76._0_4_ = auVar77._0_4_ * fVar6;
        fVar12 = auVar49._8_4_;
        auVar76._8_4_ = auVar77._8_4_ * fVar12;
        fVar15 = auVar49._12_4_;
        auVar76._12_4_ = auVar77._12_4_ * fVar15;
        fVar18 = auVar49._16_4_;
        auVar76._16_4_ = auVar77._16_4_ * fVar18;
        fVar21 = auVar49._20_4_;
        auVar76._20_4_ = auVar77._20_4_ * fVar21;
        fVar24 = auVar49._24_4_;
        auVar76._24_4_ = auVar77._24_4_ * fVar24;
        auVar76._28_4_ = auVar77._28_4_;
        auVar75 = vsubps_avx(auVar75,auVar76);
        auVar77._8_4_ = 1;
        auVar77._0_8_ = 0x100000001;
        auVar77._12_4_ = 1;
        auVar77._16_4_ = 1;
        auVar77._20_4_ = 1;
        auVar77._24_4_ = 1;
        auVar77._28_4_ = 1;
        auVar76 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar82 = vcmpps_avx(auVar82,auVar76,1);
        auVar77 = vandps_avx(auVar82,auVar77);
        auVar82 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar76,1);
        auVar80._8_4_ = 2;
        auVar80._0_8_ = 0x200000002;
        auVar80._12_4_ = 2;
        auVar80._16_4_ = 2;
        auVar80._20_4_ = 2;
        auVar80._24_4_ = 2;
        auVar80._28_4_ = 2;
        auVar76 = vandps_avx(auVar82,auVar80);
        auVar82 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar76 = vorps_avx(auVar76,auVar77);
        auVar77 = vcmpps_avx(auVar82,ZEXT1232(ZEXT812(0)) << 0x20,1);
        auVar78._8_4_ = 4;
        auVar78._0_8_ = 0x400000004;
        auVar78._12_4_ = 4;
        auVar78._16_4_ = 4;
        auVar78._20_4_ = 4;
        auVar78._24_4_ = 4;
        auVar78._28_4_ = 4;
        auVar77 = vandps_avx(auVar77,auVar78);
        auVar77 = vorps_avx(auVar76,auVar77);
        auVar25 = vpmovsxwd_avx(auVar26);
        auVar26 = vpunpckhwd_avx(auVar26,auVar26);
        auVar79._16_16_ = auVar26;
        auVar79._0_16_ = auVar25;
        auVar82 = vcmpps_avx(auVar82,auVar82,0xf);
        local_27c0 = vblendvps_avx(auVar82,auVar77,auVar79);
        do {
          lVar45 = 0;
          if (uVar38 != 0) {
            for (; (uVar38 >> lVar45 & 1) == 0; lVar45 = lVar45 + 1) {
            }
          }
          uVar40 = *(undefined4 *)(local_27c0 + lVar45 * 4);
          auVar81._4_4_ = uVar40;
          auVar81._0_4_ = uVar40;
          auVar81._8_4_ = uVar40;
          auVar81._12_4_ = uVar40;
          auVar61 = vpcmpeqd_avx(local_27c0._0_16_,auVar81);
          auVar81 = vpcmpeqd_avx(local_27c0._16_16_,auVar81);
          auVar82._16_16_ = auVar81;
          auVar82._0_16_ = auVar61;
          uVar40 = vmovmskps_avx(auVar82);
          uVar38 = uVar38 & ~CONCAT44((int)((ulong)lVar45 >> 0x20),uVar40);
        } while (uVar38 != 0);
        local_26c0 = fVar4 + fVar4 * auVar66._0_4_;
        fStack_26bc = fVar7 + fVar7 * auVar66._4_4_;
        fStack_26b8 = fVar10 + fVar10 * auVar66._8_4_;
        fStack_26b4 = fVar13 + fVar13 * auVar66._12_4_;
        fStack_26b0 = fVar16 + fVar16 * auVar66._16_4_;
        fStack_26ac = fVar19 + fVar19 * auVar66._20_4_;
        fStack_26a8 = fVar22 + fVar22 * auVar66._24_4_;
        fStack_26a4 = auVar48._28_4_ + auVar66._28_4_;
        local_26e0 = fVar5 + fVar5 * auVar54._0_4_;
        fStack_26dc = fVar8 + fVar8 * auVar54._4_4_;
        fStack_26d8 = fVar11 + fVar11 * auVar54._8_4_;
        fStack_26d4 = fVar14 + fVar14 * auVar54._12_4_;
        fStack_26d0 = fVar17 + fVar17 * auVar54._16_4_;
        fStack_26cc = fVar20 + fVar20 * auVar54._20_4_;
        fStack_26c8 = fVar23 + fVar23 * auVar54._24_4_;
        fStack_26c4 = auVar27._28_4_ + auVar54._28_4_;
        local_2700 = fVar6 + fVar6 * auVar75._0_4_;
        fStack_26fc = fVar9 + fVar9 * auVar75._4_4_;
        fStack_26f8 = fVar12 + fVar12 * auVar75._8_4_;
        fStack_26f4 = fVar15 + fVar15 * auVar75._12_4_;
        fStack_26f0 = fVar18 + fVar18 * auVar75._16_4_;
        fStack_26ec = fVar21 + fVar21 * auVar75._20_4_;
        fStack_26e8 = fVar24 + fVar24 * auVar75._24_4_;
        fStack_26e4 = auVar49._28_4_ + auVar75._28_4_;
        auVar82 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT432(0) << 0x20);
        puVar43 = auStack_2608 + 1;
        pauVar44 = (undefined1 (*) [32])local_1e40;
        auVar54._16_16_ = auVar26;
        auVar54._0_16_ = auVar25;
        local_27c0 = vorps_avx(auVar54,local_27c0);
        auVar77 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT432(0) << 0x20);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar63 = ZEXT3264(local_1e80);
        local_1e60 = vblendvps_avx(local_1e80,auVar77,auVar54);
        auVar49._8_4_ = 0xff800000;
        auVar49._0_8_ = 0xff800000ff800000;
        auVar49._12_4_ = 0xff800000;
        auVar49._16_4_ = 0xff800000;
        auVar49._20_4_ = 0xff800000;
        auVar49._24_4_ = 0xff800000;
        auVar49._28_4_ = 0xff800000;
        local_27e0 = vblendvps_avx(auVar49,auVar82,auVar54);
        uStack_2610 = 0xfffffffffffffff8;
        auStack_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
        local_2720 = local_1e60;
        local_2730 = local_1e60._16_16_;
        do {
          pauVar44 = pauVar44 + -1;
          puVar1 = puVar43 + -1;
          puVar43 = puVar43 + -1;
          bVar36 = true;
          if (*puVar1 != 0xfffffffffffffff8) {
            auVar67 = ZEXT3264(*pauVar44);
            auVar82 = vcmpps_avx(*pauVar44,local_27e0,1);
            uVar38 = *puVar1;
            if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar82 >> 0x7f,0) != '\0') ||
                  (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar82 >> 0xbf,0) != '\0') ||
                (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar82[0x1f] < '\0') {
              do {
                if ((uVar38 & 8) != 0) {
                  if (uVar38 == 0xfffffffffffffff8) goto LAB_003ac65d;
                  auVar82 = vcmpps_avx(local_27e0,auVar67._0_32_,6);
                  auVar67 = ZEXT3264(auVar82);
                  if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar82 >> 0x7f,0) != '\0') ||
                        (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar82 >> 0xbf,0) != '\0') ||
                      (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar82[0x1f] < '\0') {
                    uVar39 = (ulong)((uint)uVar38 & 0xf);
                    if (uVar39 != 8) {
                      lVar45 = 0;
                      local_27a0 = auVar82;
                      do {
                        local_2778.geomID = *(uint *)((uVar38 & 0xfffffffffffffff0) + lVar45 * 8);
                        local_2748 = (context->scene->geometries).items[local_2778.geomID].ptr;
                        uVar2 = local_2748->mask;
                        auVar52._4_4_ = uVar2;
                        auVar52._0_4_ = uVar2;
                        auVar52._8_4_ = uVar2;
                        auVar52._12_4_ = uVar2;
                        auVar52._16_4_ = uVar2;
                        auVar52._20_4_ = uVar2;
                        auVar52._24_4_ = uVar2;
                        auVar52._28_4_ = uVar2;
                        auVar82 = vandps_avx(auVar52,*(undefined1 (*) [32])(ray + 0x120));
                        auVar61 = ZEXT816(0) << 0x40;
                        auVar63 = ZEXT1664(auVar61);
                        auVar25 = vpcmpeqd_avx(auVar82._16_16_,auVar61);
                        auVar26 = vpcmpeqd_avx(auVar82._0_16_,auVar61);
                        auVar59._16_16_ = auVar25;
                        auVar59._0_16_ = auVar26;
                        auVar82 = vblendps_avx(ZEXT1632(auVar26),auVar59,0xf0);
                        auVar77 = auVar67._0_32_ & ~auVar82;
                        if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar77 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar77 >> 0x7f,0) != '\0') ||
                              (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar77 >> 0xbf,0) != '\0') ||
                            (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar77[0x1f] < '\0') {
                          local_2640 = vandnps_avx(auVar82,auVar67._0_32_);
                          local_2778.primID =
                               *(uint *)((uVar38 & 0xfffffffffffffff0) + 4 + lVar45 * 8);
                          local_2778.valid = (int *)local_2640;
                          local_2778.geometryUserPtr = local_2748->userPtr;
                          local_2778.context = context->user;
                          local_2778.N = 8;
                          local_2740 = 0;
                          local_2738 = context->args;
                          pp_Var37 = (_func_int **)local_2738->intersect;
                          if (pp_Var37 == (_func_int **)0x0) {
                            pp_Var37 = local_2748[1].super_RefCount._vptr_RefCount;
                          }
                          auVar63 = ZEXT1664(auVar61);
                          local_2778.rayhit = (RTCRayHitN *)ray;
                          (*(code *)pp_Var37)(&local_2778);
                          auVar67 = ZEXT3264(local_27a0);
                        }
                        auVar82 = auVar67._0_32_;
                        lVar45 = lVar45 + 1;
                      } while (uVar39 - 8 != lVar45);
                    }
                    local_27e0 = vblendvps_avx(local_27e0,*(undefined1 (*) [32])(ray + 0x100),
                                               auVar82);
                  }
                  break;
                }
                uVar42 = 0;
                auVar67 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                uVar39 = 0;
                uVar46 = 8;
                do {
                  uVar3 = *(ulong *)((uVar38 & 0xfffffffffffffff0) + uVar39 * 8);
                  if (uVar3 != 8) {
                    local_27a0 = auVar67._0_32_;
                    uVar40 = *(undefined4 *)(uVar38 + 0x20 + uVar39 * 4);
                    auVar55._4_4_ = uVar40;
                    auVar55._0_4_ = uVar40;
                    auVar55._8_4_ = uVar40;
                    auVar55._12_4_ = uVar40;
                    auVar55._16_4_ = uVar40;
                    auVar55._20_4_ = uVar40;
                    auVar55._24_4_ = uVar40;
                    auVar55._28_4_ = uVar40;
                    auVar35._8_8_ = uStack_2658;
                    auVar35._0_8_ = local_2660;
                    auVar35._16_8_ = uStack_2650;
                    auVar35._24_8_ = uStack_2648;
                    auVar82 = vsubps_avx(auVar55,auVar35);
                    auVar60._0_4_ = local_26c0 * auVar82._0_4_;
                    auVar60._4_4_ = fStack_26bc * auVar82._4_4_;
                    auVar60._8_4_ = fStack_26b8 * auVar82._8_4_;
                    auVar60._12_4_ = fStack_26b4 * auVar82._12_4_;
                    auVar64._16_4_ = fStack_26b0 * auVar82._16_4_;
                    auVar64._0_16_ = auVar60;
                    auVar64._20_4_ = fStack_26ac * auVar82._20_4_;
                    auVar64._28_36_ = auVar63._28_36_;
                    auVar64._24_4_ = fStack_26a8 * auVar82._24_4_;
                    uVar40 = *(undefined4 *)(uVar38 + 0x40 + uVar39 * 4);
                    auVar56._4_4_ = uVar40;
                    auVar56._0_4_ = uVar40;
                    auVar56._8_4_ = uVar40;
                    auVar56._12_4_ = uVar40;
                    auVar56._16_4_ = uVar40;
                    auVar56._20_4_ = uVar40;
                    auVar56._24_4_ = uVar40;
                    auVar56._28_4_ = uVar40;
                    auVar34._8_8_ = uStack_2678;
                    auVar34._0_8_ = local_2680;
                    auVar34._16_8_ = uStack_2670;
                    auVar34._24_8_ = uStack_2668;
                    auVar82 = vsubps_avx(auVar56,auVar34);
                    auVar65._0_4_ = local_26e0 * auVar82._0_4_;
                    auVar65._4_4_ = fStack_26dc * auVar82._4_4_;
                    auVar65._8_4_ = fStack_26d8 * auVar82._8_4_;
                    auVar65._12_4_ = fStack_26d4 * auVar82._12_4_;
                    auVar68._16_4_ = fStack_26d0 * auVar82._16_4_;
                    auVar68._0_16_ = auVar65;
                    auVar68._20_4_ = fStack_26cc * auVar82._20_4_;
                    auVar68._28_36_ = auVar67._28_36_;
                    auVar68._24_4_ = fStack_26c8 * auVar82._24_4_;
                    uVar40 = *(undefined4 *)(uVar38 + 0x60 + uVar39 * 4);
                    auVar57._4_4_ = uVar40;
                    auVar57._0_4_ = uVar40;
                    auVar57._8_4_ = uVar40;
                    auVar57._12_4_ = uVar40;
                    auVar57._16_4_ = uVar40;
                    auVar57._20_4_ = uVar40;
                    auVar57._24_4_ = uVar40;
                    auVar57._28_4_ = uVar40;
                    auVar33._8_8_ = uStack_2698;
                    auVar33._0_8_ = local_26a0;
                    auVar33._16_8_ = uStack_2690;
                    auVar33._24_8_ = uStack_2688;
                    auVar82 = vsubps_avx(auVar57,auVar33);
                    auVar53._0_4_ = local_2700 * auVar82._0_4_;
                    auVar53._4_4_ = fStack_26fc * auVar82._4_4_;
                    auVar53._8_4_ = fStack_26f8 * auVar82._8_4_;
                    auVar53._12_4_ = fStack_26f4 * auVar82._12_4_;
                    auVar29._16_4_ = fStack_26f0 * auVar82._16_4_;
                    auVar29._0_16_ = auVar53;
                    auVar29._20_4_ = fStack_26ec * auVar82._20_4_;
                    auVar29._24_4_ = fStack_26e8 * auVar82._24_4_;
                    auVar29._28_4_ = auVar82._28_4_;
                    uVar40 = *(undefined4 *)(uVar38 + 0x30 + uVar39 * 4);
                    auVar70._4_4_ = uVar40;
                    auVar70._0_4_ = uVar40;
                    auVar70._8_4_ = uVar40;
                    auVar70._12_4_ = uVar40;
                    auVar70._16_4_ = uVar40;
                    auVar70._20_4_ = uVar40;
                    auVar70._24_4_ = uVar40;
                    auVar70._28_4_ = uVar40;
                    auVar82 = vsubps_avx(auVar70,auVar35);
                    auVar73._0_4_ = local_26c0 * auVar82._0_4_;
                    auVar73._4_4_ = fStack_26bc * auVar82._4_4_;
                    auVar73._8_4_ = fStack_26b8 * auVar82._8_4_;
                    auVar73._12_4_ = fStack_26b4 * auVar82._12_4_;
                    auVar30._16_4_ = fStack_26b0 * auVar82._16_4_;
                    auVar30._0_16_ = auVar73;
                    auVar30._20_4_ = fStack_26ac * auVar82._20_4_;
                    auVar30._24_4_ = fStack_26a8 * auVar82._24_4_;
                    auVar30._28_4_ = fStack_26a4;
                    uVar40 = *(undefined4 *)(uVar38 + 0x50 + uVar39 * 4);
                    auVar71._4_4_ = uVar40;
                    auVar71._0_4_ = uVar40;
                    auVar71._8_4_ = uVar40;
                    auVar71._12_4_ = uVar40;
                    auVar71._16_4_ = uVar40;
                    auVar71._20_4_ = uVar40;
                    auVar71._24_4_ = uVar40;
                    auVar71._28_4_ = uVar40;
                    auVar82 = vsubps_avx(auVar71,auVar34);
                    auVar74._0_4_ = local_26e0 * auVar82._0_4_;
                    auVar74._4_4_ = fStack_26dc * auVar82._4_4_;
                    auVar74._8_4_ = fStack_26d8 * auVar82._8_4_;
                    auVar74._12_4_ = fStack_26d4 * auVar82._12_4_;
                    auVar31._16_4_ = fStack_26d0 * auVar82._16_4_;
                    auVar31._0_16_ = auVar74;
                    auVar31._20_4_ = fStack_26cc * auVar82._20_4_;
                    auVar31._24_4_ = fStack_26c8 * auVar82._24_4_;
                    auVar31._28_4_ = (int)((ulong)uStack_2668 >> 0x20);
                    uVar40 = *(undefined4 *)(uVar38 + 0x70 + uVar39 * 4);
                    auVar72._4_4_ = uVar40;
                    auVar72._0_4_ = uVar40;
                    auVar72._8_4_ = uVar40;
                    auVar72._12_4_ = uVar40;
                    auVar72._16_4_ = uVar40;
                    auVar72._20_4_ = uVar40;
                    auVar72._24_4_ = uVar40;
                    auVar72._28_4_ = uVar40;
                    auVar82 = vsubps_avx(auVar72,auVar33);
                    auVar69._0_4_ = local_2700 * auVar82._0_4_;
                    auVar69._4_4_ = fStack_26fc * auVar82._4_4_;
                    auVar69._8_4_ = fStack_26f8 * auVar82._8_4_;
                    auVar69._12_4_ = fStack_26f4 * auVar82._12_4_;
                    auVar32._16_4_ = fStack_26f0 * auVar82._16_4_;
                    auVar32._0_16_ = auVar69;
                    auVar32._20_4_ = fStack_26ec * auVar82._20_4_;
                    auVar32._24_4_ = fStack_26e8 * auVar82._24_4_;
                    auVar32._28_4_ = auVar82._28_4_;
                    auVar25 = vpminsd_avx(auVar64._16_16_,auVar30._16_16_);
                    auVar26 = vpminsd_avx(auVar60,auVar73);
                    auVar61 = vpminsd_avx(auVar68._16_16_,auVar31._16_16_);
                    auVar25 = vpmaxsd_avx(auVar25,auVar61);
                    auVar61 = vpminsd_avx(auVar65,auVar74);
                    auVar26 = vpmaxsd_avx(auVar26,auVar61);
                    auVar61 = vpminsd_avx(auVar53,auVar69);
                    auVar26 = vpmaxsd_avx(auVar26,auVar61);
                    auVar61 = vpminsd_avx(auVar29._16_16_,auVar32._16_16_);
                    auVar25 = vpmaxsd_avx(auVar25,auVar61);
                    auVar61 = vpmaxsd_avx(auVar26,local_2720._0_16_);
                    auVar81 = vpmaxsd_avx(auVar25,local_2730);
                    auVar50._16_16_ = auVar81;
                    auVar50._0_16_ = auVar81;
                    auVar82 = vblendps_avx(ZEXT1632(auVar61),auVar50,0xf0);
                    auVar61 = vpmaxsd_avx(auVar60,auVar73);
                    auVar81 = vpmaxsd_avx(auVar64._16_16_,auVar30._16_16_);
                    auVar60 = vpmaxsd_avx(auVar65,auVar74);
                    auVar60 = vpminsd_avx(auVar61,auVar60);
                    auVar63 = ZEXT1664(auVar60);
                    auVar61 = vpmaxsd_avx(auVar68._16_16_,auVar31._16_16_);
                    auVar65 = vpminsd_avx(auVar81,auVar61);
                    auVar61 = vpmaxsd_avx(auVar29._16_16_,auVar32._16_16_);
                    auVar81 = vpmaxsd_avx(auVar53,auVar69);
                    auVar61 = vpminsd_avx(auVar61,local_27e0._16_16_);
                    auVar61 = vpminsd_avx(auVar65,auVar61);
                    auVar81 = vpminsd_avx(auVar81,local_27e0._0_16_);
                    auVar81 = vpminsd_avx(auVar60,auVar81);
                    auVar58._16_16_ = auVar61;
                    auVar58._0_16_ = auVar81;
                    auVar82 = vcmpps_avx(auVar82,auVar58,2);
                    if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar82 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar82 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar82 >> 0x7f,0) == '\0') &&
                          (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar82 >> 0xbf,0) == '\0') &&
                        (auVar82 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar82[0x1f]) {
                      auVar67 = ZEXT3264(local_27a0);
                    }
                    else {
                      auVar51._16_16_ = auVar25;
                      auVar51._0_16_ = auVar26;
                      auVar77 = vblendps_avx(auVar51,auVar51,0xf0);
                      auVar62._8_4_ = 0x7f800000;
                      auVar62._0_8_ = 0x7f8000007f800000;
                      auVar62._12_4_ = 0x7f800000;
                      auVar62._16_4_ = 0x7f800000;
                      auVar62._20_4_ = 0x7f800000;
                      auVar62._24_4_ = 0x7f800000;
                      auVar62._28_4_ = 0x7f800000;
                      auVar82 = vblendvps_avx(auVar62,auVar77,auVar82);
                      auVar77 = vcmpps_avx(auVar82,local_27a0,1);
                      if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar77 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar77 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar77 >> 0x7f,0) == '\0') &&
                            (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar77 >> 0xbf,0) == '\0') &&
                          (auVar77 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar77[0x1f]) {
                        auVar63 = ZEXT3264(auVar82);
                        uVar41 = uVar3;
                        auVar82 = local_27a0;
LAB_003ac3e8:
                        uVar42 = uVar42 + 1;
                        *puVar43 = uVar41;
                        puVar43 = puVar43 + 1;
                        *pauVar44 = auVar63._0_32_;
                        pauVar44 = pauVar44 + 1;
                      }
                      else {
                        auVar63 = ZEXT3264(local_27a0);
                        bVar47 = uVar46 != 8;
                        uVar41 = uVar46;
                        uVar46 = uVar3;
                        if (bVar47) goto LAB_003ac3e8;
                      }
                      auVar67 = ZEXT3264(auVar82);
                    }
                  }
                } while ((uVar3 != 8) && (bVar47 = uVar39 < 3, uVar39 = uVar39 + 1, bVar47));
                if (1 < uVar42 && uVar46 != 8) {
                  auVar82 = pauVar44[-2];
                  auVar77 = pauVar44[-1];
                  auVar63 = ZEXT3264(auVar77);
                  auVar76 = vcmpps_avx(auVar82,auVar77,1);
                  if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar76 >> 0x7f,0) != '\0') ||
                        (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar76 >> 0xbf,0) != '\0') ||
                      (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar76[0x1f] < '\0') {
                    pauVar44[-2] = auVar77;
                    pauVar44[-1] = auVar82;
                    auVar25 = vpermilps_avx(*(undefined1 (*) [16])(puVar43 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar43 + -2) = auVar25;
                  }
                  if (uVar42 != 2) {
                    auVar82 = pauVar44[-3];
                    auVar77 = vcmpps_avx(auVar82,pauVar44[-1],1);
                    if ((((((((auVar77 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar77 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar77 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar77 >> 0x7f,0) != '\0') ||
                          (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar77 >> 0xbf,0) != '\0') ||
                        (auVar77 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar77[0x1f] < '\0') {
                      pauVar44[-3] = pauVar44[-1];
                      pauVar44[-1] = auVar82;
                      uVar38 = puVar43[-3];
                      puVar43[-3] = puVar43[-1];
                      puVar43[-1] = uVar38;
                    }
                    auVar82 = pauVar44[-3];
                    auVar77 = pauVar44[-2];
                    auVar63 = ZEXT3264(auVar77);
                    auVar76 = vcmpps_avx(auVar82,auVar77,1);
                    if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar76 >> 0x7f,0) != '\0') ||
                          (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar76 >> 0xbf,0) != '\0') ||
                        (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar76[0x1f] < '\0') {
                      pauVar44[-3] = auVar77;
                      pauVar44[-2] = auVar82;
                      auVar25 = vpermilps_avx(*(undefined1 (*) [16])(puVar43 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar43 + -3) = auVar25;
                    }
                  }
                }
                uVar38 = uVar46;
              } while (uVar46 != 8);
            }
            bVar36 = false;
          }
LAB_003ac65d:
        } while (!bVar36);
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }